

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH_INLINE_XXH128_hash_t XXH_INLINE_XXH128(void *input,size_t len,XXH64_hash_t seed)

{
  size_t in_RDX;
  void *in_RSI;
  XXH_INLINE_XXH128_hash_t XVar1;
  
  XVar1 = XXH_INLINE_XXH3_128bits_withSeed(in_RSI,in_RDX,0x10aa05);
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t
XXH128(const void* input, size_t len, XXH64_hash_t seed)
{
    return XXH3_128bits_withSeed(input, len, seed);
}